

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int autotest(void)

{
  pointer pcVar1;
  Vector *first;
  Vector *other;
  int iVar2;
  VectorHori v4;
  VectorHori v3;
  undefined1 local_a0 [40];
  int local_78;
  int *local_70;
  VectorHori local_68;
  
  first = (Vector *)operator_new(0x38);
  pcVar1 = local_a0 + 0x10;
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Test.txt","");
  VECTOR_HORI_VERT::VectorHori::VectorHori((VectorHori *)first,(string *)local_a0,0x49);
  if ((pointer)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  other = (Vector *)operator_new(0x38);
  local_a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Test.txt","");
  VECTOR_HORI_VERT::VectorHori::VectorHori((VectorHori *)other,(string *)local_a0,0x39);
  if ((pointer)local_a0._0_8_ != pcVar1) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  VECTOR_HORI_VERT::operator-((VectorHori *)local_a0,first,other);
  VECTOR_HORI_VERT::operator+(&local_68,first,other);
  if ((((*local_68.super_Vector.vector_ != 1) || (local_68.super_Vector.vector_[1] != 3)) ||
      (local_68.super_Vector.vector_[2] != 0)) ||
     (((local_68.super_Vector.L != 3 || (*local_70 != 1)) ||
      ((local_70[1] != 6 || (iVar2 = 0, local_78 != 2)))))) {
    iVar2 = 1;
    VECTOR_HORI_VERT::VectorHori::Output((VectorHori *)local_a0);
  }
  (*other->_vptr_Vector[2])(other);
  (*first->_vptr_Vector[2])(first);
  VECTOR_HORI_VERT::VectorHori::~VectorHori(&local_68);
  VECTOR_HORI_VERT::VectorHori::~VectorHori((VectorHori *)local_a0);
  return iVar2;
}

Assistant:

int autotest(){
    try
    {
    Vector* v1=new VectorHori("Test.txt",73);
    Vector* v2=new VectorHori("Test.txt",57);
    VectorHori v4=*v1-*v2;
    VectorHori v3=*v1+*v2;
    if ( (v3.vector_[0]==1) && (v3.vector_[1]==3) && (v3.vector_[2]==0) && (v3.L==3)
      && (v4.vector_[0]==1) && (v4.vector_[1]==6) && (v4.L==2) ){
        delete v2;
        delete v1;
        return 0;
    }else{
        v4.Output();
        delete v2;
        delete v1;
        return 1;
    }
    }
    catch (const std::exception& e) {
        std::cerr << e.what() << std::endl;
        return -1;
    }
}